

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlChar * xmlTextReaderName(xmlTextReaderPtr reader)

{
  xmlChar *pxVar1;
  xmlNsPtr ns;
  xmlNodePtr pxVar2;
  _xmlNode *add;
  char *cur;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNodePtr)0x0)) {
    return (xmlChar *)0x0;
  }
  pxVar2 = reader->node;
  if (reader->curnode != (xmlNodePtr)0x0) {
    pxVar2 = reader->curnode;
  }
  switch(pxVar2->type) {
  case XML_ELEMENT_NODE:
  case XML_ATTRIBUTE_NODE:
    if ((pxVar2->ns != (xmlNs *)0x0) && (pxVar1 = pxVar2->ns->prefix, pxVar1 != (xmlChar *)0x0)) {
      pxVar1 = xmlStrdup(pxVar1);
      pxVar1 = xmlStrcat(pxVar1,":");
      add = (_xmlNode *)pxVar2->name;
      goto LAB_0019ea33;
    }
  case XML_ENTITY_REF_NODE:
  case XML_ENTITY_NODE:
  case XML_PI_NODE:
  case XML_DOCUMENT_TYPE_NODE:
  case XML_NOTATION_NODE:
  case XML_DTD_NODE:
    cur = (char *)pxVar2->name;
    break;
  case XML_TEXT_NODE:
    cur = "#text";
    break;
  case XML_CDATA_SECTION_NODE:
    cur = "#cdata-section";
    break;
  case XML_COMMENT_NODE:
    cur = "#comment";
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    cur = "#document";
    break;
  case XML_DOCUMENT_FRAG_NODE:
    cur = "#document-fragment";
    break;
  default:
    return (xmlChar *)0x0;
  case XML_NAMESPACE_DECL:
    pxVar1 = xmlStrdup("xmlns");
    if (pxVar2->children == (_xmlNode *)0x0) {
      return pxVar1;
    }
    pxVar1 = xmlStrcat(pxVar1,":");
    add = pxVar2->children;
LAB_0019ea33:
    pxVar1 = xmlStrcat(pxVar1,(xmlChar *)add);
    return pxVar1;
  }
  pxVar1 = xmlStrdup((xmlChar *)cur);
  return pxVar1;
}

Assistant:

xmlChar *
xmlTextReaderName(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    xmlChar *ret;

    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;
    switch (node->type) {
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
	    if ((node->ns == NULL) ||
		(node->ns->prefix == NULL))
		return(xmlStrdup(node->name));

	    ret = xmlStrdup(node->ns->prefix);
	    ret = xmlStrcat(ret, BAD_CAST ":");
	    ret = xmlStrcat(ret, node->name);
	    return(ret);
        case XML_TEXT_NODE:
	    return(xmlStrdup(BAD_CAST "#text"));
        case XML_CDATA_SECTION_NODE:
	    return(xmlStrdup(BAD_CAST "#cdata-section"));
        case XML_ENTITY_NODE:
        case XML_ENTITY_REF_NODE:
	    return(xmlStrdup(node->name));
        case XML_PI_NODE:
	    return(xmlStrdup(node->name));
        case XML_COMMENT_NODE:
	    return(xmlStrdup(BAD_CAST "#comment"));
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    return(xmlStrdup(BAD_CAST "#document"));
        case XML_DOCUMENT_FRAG_NODE:
	    return(xmlStrdup(BAD_CAST "#document-fragment"));
        case XML_NOTATION_NODE:
	    return(xmlStrdup(node->name));
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DTD_NODE:
	    return(xmlStrdup(node->name));
        case XML_NAMESPACE_DECL: {
	    xmlNsPtr ns = (xmlNsPtr) node;

	    ret = xmlStrdup(BAD_CAST "xmlns");
	    if (ns->prefix == NULL)
		return(ret);
	    ret = xmlStrcat(ret, BAD_CAST ":");
	    ret = xmlStrcat(ret, ns->prefix);
	    return(ret);
	}

        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
	    return(NULL);
    }
    return(NULL);
}